

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
::SingleFileIndexedStorage
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
           *this,path *storageFilePath,shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  __shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
  ::OrderedStorage(&this->
                    super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                   ,(InnerRegisterSupplier *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_001f9410;
  std::
  make_shared<supermap::io::TemporaryFile,std::filesystem::__cxx11::path_const&,std::shared_ptr<supermap::io::FileManager>>
            ((path *)&this->storageFile_,(shared_ptr<supermap::io::FileManager> *)storageFilePath);
  std::__shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(((this->storageFile_).
                super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)
  ;
  io::FileManager::create(local_30._M_ptr,storageFilePath);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

explicit SingleFileIndexedStorage(const std::filesystem::path &storageFilePath,
                                      std::shared_ptr<io::FileManager> fileManager,
                                      InnerRegisterSupplier registerSupplier)
        : IndexedStorage<T, IndexT, RegisterInfo>(std::move(registerSupplier)),
          storageFile_(std::make_shared<io::TemporaryFile>(storageFilePath, std::move(fileManager))) {
        storageFile_->getFileManager()->create(storageFilePath);
    }